

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode AcceptServerConnect(connectdata *conn)

{
  Curl_easy *data;
  int iVar1;
  int iVar2;
  curl_socklen_t size;
  Curl_sockaddr_storage add;
  socklen_t local_a4;
  sockaddr local_a0 [8];
  
  data = conn->data;
  iVar2 = conn->sock[1];
  local_a4 = 0x80;
  iVar1 = getsockname(iVar2,local_a0,&local_a4);
  if (iVar1 == 0) {
    local_a4 = 0x80;
    iVar1 = accept(iVar2,local_a0,&local_a4);
    Curl_closesocket(conn,iVar2);
    if (iVar1 != -1) {
      Curl_infof(data,"Connection accepted from server\n");
      (conn->bits).do_more = false;
      conn->sock[1] = iVar1;
      curlx_nonblock(iVar1,1);
      conn->sock_accepted[1] = true;
      if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
        return CURLE_OK;
      }
      Curl_set_in_callback(data,true);
      iVar2 = (*(data->set).fsockopt)((data->set).sockopt_client,iVar1,CURLSOCKTYPE_ACCEPT);
      Curl_set_in_callback(data,false);
      if (iVar2 == 0) {
        return CURLE_OK;
      }
      if (conn->sock[1] != -1) {
        Curl_closesocket(conn,conn->sock[1]);
        conn->sock[1] = -1;
      }
      (conn->bits).tcpconnect[1] = false;
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  else {
    Curl_closesocket(conn,iVar2);
  }
  Curl_failf(data,"Error accept()ing server connect");
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode AcceptServerConnect(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s = accept(sock, (struct sockaddr *) &add, &size);
  }
  Curl_closesocket(conn, sock); /* close the first socket */

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server\n");
  /* when this happens within the DO state it is important that we mark us as
     not needing DO_MORE anymore */
  conn->bits.do_more = FALSE;

  conn->sock[SECONDARYSOCKET] = s;
  (void)curlx_nonblock(s, TRUE); /* enable non-blocking */
  conn->sock_accepted[SECONDARYSOCKET] = TRUE;

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);
    Curl_set_in_callback(data, false);

    if(error) {
      close_secondarysocket(conn);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}